

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inflate_sync.cc
# Opt level: O0

void __thiscall inflate_sync_Test::TestBody(inflate_sync_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int err;
  size_t uncompr_len;
  size_t compr_len;
  uint8_t uncompr [128];
  uint8_t compr [128];
  zng_stream d_stream;
  zng_stream c_stream;
  undefined4 in_stack_fffffffffffffba8;
  int32_t in_stack_fffffffffffffbac;
  zng_stream *in_stack_fffffffffffffbb0;
  int *in_stack_fffffffffffffbb8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  zng_stream *in_stack_fffffffffffffbc8;
  int line;
  char *in_stack_fffffffffffffbd0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffbdc;
  Type type;
  AssertHelper *in_stack_fffffffffffffbe0;
  int32_t in_stack_fffffffffffffbf4;
  zng_stream *in_stack_fffffffffffffbf8;
  Message *in_stack_fffffffffffffc28;
  AssertHelper *in_stack_fffffffffffffc30;
  AssertionResult *this_03;
  undefined8 in_stack_fffffffffffffc70;
  int32_t flush;
  zng_stream *strm;
  AssertionResult local_360 [2];
  undefined4 local_33c;
  AssertionResult local_338 [2];
  undefined4 local_314;
  AssertionResult local_310 [2];
  undefined4 local_2ec;
  AssertionResult local_2e8 [2];
  undefined4 local_2c4;
  AssertionResult local_2c0 [2];
  undefined4 local_29c;
  AssertionResult local_298 [2];
  undefined4 local_274;
  AssertionResult local_270 [2];
  undefined4 local_24c;
  AssertionResult local_248 [3];
  undefined4 local_214;
  zng_stream local_210;
  undefined1 local_168 [3];
  char local_165;
  undefined1 *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  size_t *psStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  flush = (int32_t)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  local_210.avail_out = 0x80;
  local_210._36_4_ = 0;
  local_210.next_out = (uint8_t *)0x80;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (char *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_210.total_in._4_4_ = zng_deflateInit(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
  local_214 = 0;
  strm = &local_210;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)strm);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x150f4a);
    flush = (int32_t)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x150fad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151005);
  local_78 = "hello, hello!";
  puStack_60 = local_168;
  uStack_70 = CONCAT44(uStack_70._4_4_,3);
  local_58 = CONCAT44(local_58._4_4_,local_210.avail_out);
  local_210.total_in._4_4_ = zng_deflate(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
  local_24c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x151103);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x151166);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1511be);
  local_165 = local_165 + '\x01';
  uStack_70 = CONCAT44(uStack_70._4_4_,0xb);
  local_210.total_in._4_4_ = zng_deflate(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
  local_274 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15129f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x151302);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15135a);
  local_210.total_in._4_4_ =
       zng_deflateEnd((zng_stream *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_29c = 0;
  this_03 = local_298;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffc28 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x15141b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x15147e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1514d6);
  local_210.avail_out = (uint32_t)uStack_50;
  local_210._36_4_ = uStack_50._4_4_;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  psStack_d0 = (size_t *)0x0;
  local_88 = 0;
  local_e8 = local_168;
  uStack_e0 = 2;
  local_210.total_in._4_4_ = zng_inflateInit((zng_stream *)0x15154d);
  local_2c4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1515f5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x151652);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1516aa);
  psStack_d0 = &local_210.total_out;
  local_c8 = CONCAT44(local_c8._4_4_,local_210.next_out._0_4_);
  local_210.total_in._4_4_ = zng_inflate(strm,flush);
  local_2ec = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x15177f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x1517dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151834);
  uStack_e0 = CONCAT44(uStack_e0._4_4_,local_210.avail_out - 2);
  local_210.total_in._4_4_ = zng_inflateSync(in_stack_fffffffffffffbc8);
  local_314 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1518fa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x151957);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1519af);
  local_210.total_in._4_4_ = zng_inflate(strm,flush);
  local_33c = 1;
  this_02 = local_338;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbdc);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbc8 =
         (zng_stream *)testing::AssertionResult::failure_message((AssertionResult *)0x151a69);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbb0);
    testing::Message::~Message((Message *)0x151ac6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151b1b);
  local_210.total_in._4_4_ =
       zng_inflateEnd((zng_stream *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  this_01 = local_360;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffbc8,
             (char *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),(int *)this_01,
             (int *)in_stack_fffffffffffffbb0);
  line = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbe0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x151bd0)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbe0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_03,in_stack_fffffffffffffc28);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x151c2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151c82);
  return;
}

Assistant:

TEST(inflate, sync) {
    PREFIX3(stream) c_stream, d_stream;
    uint8_t compr[128], uncompr[128];
    z_size_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    int err;

    memset(&c_stream, 0, sizeof(c_stream));

    /* build compressed stream with full flush */
    err = PREFIX(deflateInit)(&c_stream, Z_DEFAULT_COMPRESSION);
    EXPECT_EQ(err, Z_OK);

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;
    c_stream.avail_in = 3;
    c_stream.avail_out = (uint32_t)compr_len;

    err = PREFIX(deflate)(&c_stream, Z_FULL_FLUSH);
    EXPECT_EQ(err, Z_OK);

    /* force an error in first compressed block */
    compr[3]++;
    c_stream.avail_in = hello_len-3;

    err = PREFIX(deflate)(&c_stream, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);

    err = PREFIX(deflateEnd)(&c_stream);
    EXPECT_EQ(err, Z_OK);

    compr_len = (z_size_t)c_stream.total_out;

    memset(&d_stream, 0, sizeof(d_stream));
    /* just read the zlib header */
    d_stream.next_in = compr;
    d_stream.avail_in = 2;

    err = PREFIX(inflateInit)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uint32_t)uncompr_len;

    err = PREFIX(inflate)(&d_stream, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_OK);

    /* read all compressed data, but skip damaged part */
    d_stream.avail_in = (uint32_t)compr_len-2;
    err = PREFIX(inflateSync)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    err = PREFIX(inflate)(&d_stream, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);

    err = PREFIX(inflateEnd)(&d_stream);
    EXPECT_EQ(err, Z_OK);
}